

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

int __thiscall sysapi::epoll::run_timers_calculate_timeout(epoll *this)

{
  bool bVar1;
  rep rVar2;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  duration<long,_std::ratio<1L,_1000000000L>_> local_38;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  duration local_28;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point now;
  epoll *this_local;
  
  now.__d.__r = (duration)(duration)this;
  bVar1 = timer::empty(&this->timer_);
  if (bVar1) {
    this_local._4_4_ = -1;
  }
  else {
    local_28.__r = std::chrono::_V2::steady_clock::now();
    local_20.__d.__r = (duration)(duration)local_28.__r;
    timer::notify(&this->timer_,(time_point)local_28.__r);
    bVar1 = timer::empty(&this->timer_);
    if (bVar1) {
      this_local._4_4_ = -1;
    }
    else {
      local_40.__d.__r = (duration)timer::top(&this->timer_);
      local_38.__r = (rep)std::chrono::operator-(&local_40,&local_20);
      local_30.__r = (rep)std::chrono::
                          duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                    (&local_38);
      rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_30);
      this_local._4_4_ = (int)rVar2;
    }
  }
  return this_local._4_4_;
}

Assistant:

int epoll::run_timers_calculate_timeout()
{
    if (timer_.empty())
        return -1;

    timer::clock_t::time_point now = timer::clock_t::now();
    timer_.notify(now);

    if (timer_.empty())
        return -1;

    return std::chrono::duration_cast<std::chrono::milliseconds>(timer_.top() - now).count();
}